

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# externals.c
# Opt level: O1

course_html_parts ucrcourse_get_html(course_query *query)

{
  course_html_parts cVar1;
  char *response;
  char *local_18;
  char *pcStack_10;
  
  response = do_request(query);
  if (response == (char *)0x0) {
    local_18 = (char *)0x0;
    pcStack_10 = (char *)0x0;
  }
  else {
    extract_html(response,&local_18,&pcStack_10);
    free(response);
  }
  cVar1.details = pcStack_10;
  cVar1.listings = local_18;
  return cVar1;
}

Assistant:

struct course_html_parts ucrcourse_get_html(const struct course_query *query)
{
	struct course_html_parts result;
	char *response;

	response = ucrcourse_get_raw(query);
	if (!response) {
		result.listings = NULL;
		result.details = NULL;
		return result;
	}

	extract_html(response, &result.listings, &result.details);
	free(response);
	return result;
}